

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_CLOUD *ppRVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  long center_global;
  char *pcVar8;
  REF_INT node;
  long lVar9;
  REF_DBL *pRVar10;
  bool bVar11;
  REF_CLOUD ref_cloud;
  REF_DBL node_hessian [3];
  REF_DBL n [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_CLOUD local_d0;
  REF_DBL *local_c8;
  REF_CLOUD *local_c0;
  REF_GRID local_b8;
  REF_DBL *local_b0;
  REF_DBL local_a8;
  REF_DBL RStack_a0;
  REF_DBL local_98;
  REF_DBL local_88 [4];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_node = ref_grid->node;
  iVar2 = ref_node->max;
  uVar7 = (ulong)iVar2;
  if ((long)uVar7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670,
           "ref_recon_rsn_hess","malloc one_layer of REF_CLOUD negative");
    RVar6 = 1;
  }
  else {
    ref_cell = ref_grid->cell[3];
    local_b8 = ref_grid;
    ppRVar4 = (REF_CLOUD *)malloc(uVar7 * 8);
    local_c0 = ppRVar4;
    if (ppRVar4 == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670
             ,"ref_recon_rsn_hess","malloc one_layer of REF_CLOUD NULL");
      RVar6 = 2;
    }
    else {
      local_c8 = hessian;
      if (iVar2 != 0) {
        lVar9 = 0;
        local_b0 = scalar;
        memset(ppRVar4,0,uVar7 * 8);
        scalar = local_b0;
        do {
          if (-1 < ref_node->global[lVar9]) {
            uVar1 = ref_cloud_create(ppRVar4,4);
            if (uVar1 != 0) {
              uVar7 = (ulong)uVar1;
              pcVar8 = "cloud storage";
              uVar5 = 0x672;
              goto LAB_001a9807;
            }
            uVar7 = (ulong)(uint)ref_node->max;
          }
          lVar9 = lVar9 + 1;
          ppRVar4 = ppRVar4 + 1;
        } while (lVar9 < (int)uVar7);
      }
      ppRVar4 = local_c0;
      uVar1 = ref_recon_local_immediate_cloud(local_c0,ref_node,ref_cell,scalar);
      if (uVar1 == 0) {
        uVar1 = ref_recon_ghost_cloud(ppRVar4,ref_node);
        if (uVar1 == 0) {
          iVar2 = ref_node->max;
          pRVar10 = local_c8;
          if (0 < iVar2) {
            lVar9 = 0;
            do {
              if ((-1 < ref_node->global[lVar9]) && (ref_node->ref_mpi->id == ref_node->part[lVar9])
                 ) {
                node = (REF_INT)lVar9;
                uVar1 = ref_recon_rsn(local_b8,node,local_48,local_68,local_88);
                if (uVar1 != 0) {
                  uVar7 = (ulong)uVar1;
                  pcVar8 = "rsn";
                  uVar5 = 0x67a;
                  goto LAB_001a9807;
                }
                uVar1 = ref_cloud_deep_copy(&local_d0,ppRVar4[lVar9]);
                if (uVar1 != 0) {
                  uVar7 = (ulong)uVar1;
                  pcVar8 = "create ref_cloud";
                  uVar5 = 0x67c;
                  goto LAB_001a9807;
                }
                pRVar10 = (REF_DBL *)((lVar9 * 0x18 & 0x7fffffff8U) + (long)local_c8);
                uVar1 = 2;
                do {
                  uVar3 = ref_recon_grow_cloud_one_layer(local_d0,ppRVar4,ref_node);
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar8 = "grow";
                    uVar5 = 0x680;
                    goto LAB_001a9807;
                  }
                  center_global = -1;
                  if ((lVar9 < ref_node->max) &&
                     (center_global = ref_node->global[lVar9], center_global < 0)) {
                    center_global = -1;
                  }
                  uVar3 = ref_recon_kexact_rs(center_global,local_d0,local_48,local_68,&local_a8);
                  pcVar8 = "REF_DIV_ZERO";
                  if ((uVar3 == 4 && 4 < uVar1) ||
                     (pcVar8 = "REF_ILL_CONDITIONED", uVar3 == 8 && 4 < uVar1)) {
                    ref_node_location(ref_node,node);
                    printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar8,(ulong)uVar1)
                    ;
                  }
                  ppRVar4 = local_c0;
                } while ((uVar3 != 0) && (bVar11 = uVar1 < 8, uVar1 = uVar1 + 1, bVar11));
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x68f,"ref_recon_rsn_hess",(ulong)uVar3,"kexact qr node");
                  ref_node_location(ref_node,node);
                  return uVar3;
                }
                pRVar10[2] = local_98;
                *pRVar10 = local_a8;
                pRVar10[1] = RStack_a0;
                uVar1 = ref_cloud_free(local_d0);
                if (uVar1 != 0) {
                  uVar7 = (ulong)uVar1;
                  pcVar8 = "free ref_cloud";
                  uVar5 = 0x693;
                  goto LAB_001a9807;
                }
                iVar2 = ref_node->max;
              }
              pRVar10 = local_c8;
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar2);
            if (0 < iVar2) {
              lVar9 = 0;
              do {
                if (-1 < ref_node->global[lVar9]) {
                  ref_cloud_free(ppRVar4[lVar9]);
                  iVar2 = ref_node->max;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < iVar2);
            }
          }
          free(ppRVar4);
          uVar1 = ref_node_ghost_dbl(ref_node,pRVar10,3);
          if (uVar1 == 0) {
            uVar1 = ref_recon_abs_value_hessian2((REF_GRID)local_b8->node,pRVar10);
            if (uVar1 == 0) {
              return 0;
            }
            uVar7 = (ulong)uVar1;
            pcVar8 = "abs(H)";
            uVar5 = 0x69e;
          }
          else {
            uVar7 = (ulong)uVar1;
            pcVar8 = "update ghosts";
            uVar5 = 0x69c;
          }
        }
        else {
          uVar7 = (ulong)uVar1;
          pcVar8 = "fill ghosts";
          uVar5 = 0x676;
        }
      }
      else {
        uVar7 = (ulong)uVar1;
        pcVar8 = "fill immediate cloud";
        uVar5 = 0x675;
      }
LAB_001a9807:
      RVar6 = (REF_STATUS)uVar7;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar5
             ,"ref_recon_rsn_hess",uVar7,pcVar8);
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid, REF_DBL *scalar,
                                      REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }
  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");

        status = ref_recon_kexact_rs(ref_node_global(ref_node, node), ref_cloud,
                                     r, s, node_hessian);
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      RSB(status, "kexact qr node", { ref_node_location(ref_node, node); });
      for (im = 0; im < 3; im++) {
        hessian[im + 3 * node] = node_hessian[im];
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}